

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O0

ktx_error_code_e ktxHashListEntry_GetValue(ktxHashListEntry *This,uint *pValueLen,void **ppValue)

{
  void *local_30;
  ktxKVListEntry *kv;
  void **ppValue_local;
  uint *pValueLen_local;
  ktxHashListEntry *This_local;
  ktx_error_code_e local_4;
  
  if ((pValueLen == (uint *)0x0) || (ppValue == (void **)0x0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    *pValueLen = This->valueLen;
    if (This->valueLen == 0) {
      local_30 = (void *)0x0;
    }
    else {
      local_30 = This->value;
    }
    *ppValue = local_30;
    local_4 = KTX_SUCCESS;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxHashListEntry_GetValue(ktxHashListEntry* This,
                          unsigned int* pValueLen, void** ppValue)
{
    if (pValueLen && ppValue) {
        ktxKVListEntry* kv = (ktxKVListEntry*)This;
        *pValueLen = kv->valueLen;
        *ppValue = kv->valueLen > 0 ? kv->value : NULL;
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}